

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-textblock.c
# Opt level: O1

void text_out_to_file(uint8_t a,char *str)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  wchar_t wVar7;
  uint uVar8;
  byte *pbVar9;
  wchar_t i;
  wchar_t wVar10;
  uint uVar11;
  uint uVar12;
  size_t n;
  char buf [1024];
  byte local_438 [1032];
  
  wVar7 = L'K';
  if (text_out_wrap != L'\0') {
    wVar7 = text_out_wrap;
  }
  my_strcpy((char *)local_438,str,0x400);
  pbVar1 = local_438;
  do {
    if (local_438[0] == 0) {
      return;
    }
    uVar11 = wVar7 - text_out_to_file::pos;
    uVar8 = 0;
    if (0 < (int)uVar11) {
      uVar8 = uVar11;
    }
    if ((text_out_to_file::pos == L'\0') && (L'\0' < text_out_indent)) {
      wVar10 = L'\0';
      text_out_to_file::pos = L'\0';
      do {
        file_writec(text_out_file,' ');
        text_out_to_file::pos = text_out_to_file::pos + L'\x01';
        wVar10 = wVar10 + L'\x01';
      } while (wVar10 < text_out_indent);
    }
    if ((int)uVar11 < 1) {
      uVar4 = 0xffffffff;
      uVar12 = 0;
    }
    else {
      uVar5 = 0xffffffff;
      uVar6 = 0;
      do {
        uVar4 = (uint)uVar5;
        bVar2 = pbVar1[uVar6];
        uVar12 = (uint)uVar6;
        if ((bVar2 == 0) || (bVar2 == 10)) break;
        if (bVar2 == 0x20) {
          uVar5 = uVar6 & 0xffffffff;
        }
        uVar4 = (uint)uVar5;
        uVar6 = uVar6 + 1;
        uVar12 = uVar11;
      } while (uVar11 != uVar6);
    }
    if ((uVar4 == 0xffffffff) && (uVar12 == uVar8)) {
      if ((text_out_to_file::pos == text_out_indent) ||
         (((ulong)*pbVar1 < 0x2f &&
          (uVar12 = 1, (0x500100000000U >> ((ulong)*pbVar1 & 0x3f) & 1) != 0)))) goto LAB_00215574;
      file_writec(text_out_file,'\n');
      text_out_to_file::pos = L'\0';
      bVar3 = false;
      pbVar9 = pbVar1;
    }
    else {
      if ((pbVar1[uVar12] != 0) && (pbVar1[uVar12] != 10)) {
        uVar12 = uVar4;
      }
LAB_00215574:
      n = (size_t)(int)uVar12;
      file_write(text_out_file,(char *)pbVar1,n);
      text_out_to_file::pos = text_out_to_file::pos + uVar12;
      pbVar9 = pbVar1 + n;
      if (pbVar1[n] == 0) {
        bVar3 = true;
      }
      else {
        if (pbVar1[n] == 10) {
          pbVar9 = pbVar9 + 1;
        }
        file_writec(text_out_file,'\n');
        text_out_to_file::pos = L'\0';
        pbVar9 = pbVar9 + -1;
        do {
          pbVar1 = pbVar9 + 1;
          pbVar9 = pbVar9 + 1;
        } while (*pbVar1 == 0x20);
        bVar3 = false;
      }
    }
    if (bVar3) {
      return;
    }
    local_438[0] = *pbVar9;
    pbVar1 = pbVar9;
  } while( true );
}

Assistant:

void text_out_to_file(uint8_t a, const char *str)
{
	const char *s;
	char buf[1024];

	/* Current position on the line */
	static int pos = 0;

	/* Wrap width */
	int wrap = (text_out_wrap ? text_out_wrap : 75);

	/* Unused parameter */
	(void)a;

	/* Copy to a rewriteable string */
 	my_strcpy(buf, str, 1024);

	/* Current location within "buf" */
 	s = buf;

	/* Process the string */
	while (*s) {
		int n = 0;
		int len = wrap - pos;
		int l_space = -1;

		/* In case we are already past the wrap point (which can happen with
		 * punctuation at the end of the line), make sure we don't overrun.
		 */
		if (len < 0)
			len = 0;

		/* If we are at the start of the line... */
		if (pos == 0) {
			int i;

			/* Output the indent */
			for (i = 0; i < text_out_indent; i++) {
				file_writec(text_out_file, ' ');
				pos++;
			}
		}

		/* Find length of line up to next newline or end-of-string */
		while ((n < len) && !((s[n] == '\n') || (s[n] == '\0'))) {
			/* Mark the most recent space in the string */
			if (s[n] == ' ') l_space = n;

			/* Increment */
			n++;
		}

		/* If we have encountered no spaces */
		if ((l_space == -1) && (n == len)) {
			/* If we are at the start of a new line */
			if (pos == text_out_indent) {
				len = n;
			} else if ((s[0] == ' ') || (s[0] == ',') || (s[0] == '.')) {
				/* HACK - Output punctuation at the end of the line */
				len = 1;
			} else {
				/* Begin a new line */
				file_writec(text_out_file, '\n');

				/* Reset */
				pos = 0;

				continue;
			}
		} else {
			/* Wrap at the newline */
			if ((s[n] == '\n') || (s[n] == '\0')) len = n;

			/* Wrap at the last space */
			else len = l_space;
		}

		/* Write that line to file */
		file_write(text_out_file, s, len);
		pos += len;

		/* Move 's' past the stuff we've written */
		s += len;

		/* If we are at the end of the string, end */
		if (*s == '\0') return;

		/* Skip newlines */
		if (*s == '\n') s++;

		/* Begin a new line */
		file_writec(text_out_file, '\n');

		/* Reset */
		pos = 0;

		/* Skip whitespace */
		while (*s == ' ') s++;
	}

	/* We are done */
	return;
}